

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::SharedRenderingPerfCase::iterate(SharedRenderingPerfCase *this)

{
  pointer *pppTVar1;
  uint uVar2;
  TestLog *pTVar3;
  pointer ppTVar4;
  TestContext *this_00;
  undefined8 uVar5;
  pointer ppTVar6;
  MessageBuilder *pMVar7;
  ulong uVar8;
  _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *this_01;
  _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *__dest;
  TestThread *pTVar9;
  vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *pvVar10;
  pointer __dest_00;
  deUint64 dVar11;
  SampleBuilder *this_02;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  string *unit;
  int precision;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t sVar15;
  char *extraout_RDX_05;
  void *__buf;
  void *__buf_00;
  int threadNdx_1;
  int iVar16;
  IterateResult IVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  int resultNdx;
  _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *this_03;
  pointer ppTVar21;
  size_t sVar22;
  vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *__p;
  int iVar23;
  pointer ppTVar24;
  ulong uVar25;
  int threadNdx;
  int iVar26;
  long lVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  allocator<char> local_2fd;
  allocator<char> local_2fc;
  allocator<char> local_2fb;
  allocator<char> local_2fa;
  allocator<char> local_2f9;
  _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  *local_2f8;
  int local_2ec;
  vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  threads;
  vector<unsigned_long,_std::allocator<unsigned_long>_> resultsUs;
  ScopedLogSection threadSection;
  LogSampleList local_278;
  string local_238;
  string local_218;
  vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  threadContexts;
  string local_70;
  string local_50;
  
  threads.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  threads.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->m_results).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0020b611;
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&threadContexts,"Test info",(allocator<char> *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Test information",(allocator<char> *)&local_238);
  tcu::ScopedLogSection::ScopedLogSection
            (&threadSection,pTVar3,(string *)&threadContexts,&local_278.m_name);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&threadContexts);
  pppTVar1 = &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
  std::operator<<((ostream *)pppTVar1,"Total triangles rendered: : ");
  std::ostream::operator<<
            (pppTVar1,(this->m_config).drawCallCount * (this->m_config).triangleCount *
                      (this->m_config).frameCount * (this->m_config).perThreadContextCount *
                      (this->m_config).threadCount);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  pppTVar1 = &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
  std::operator<<((ostream *)pppTVar1,"Number of threads: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&threadContexts,&(this->m_config).threadCount);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  pppTVar1 = &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
  std::operator<<((ostream *)pppTVar1,"Number of contexts used to render with each thread: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&threadContexts,&(this->m_config).perThreadContextCount);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  pppTVar1 = &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
  std::operator<<((ostream *)pppTVar1,"Number of frames rendered with each context: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&threadContexts,&(this->m_config).frameCount);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  pppTVar1 = &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
  std::operator<<((ostream *)pppTVar1,"Number of draw calls performed by each frame: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&threadContexts,&(this->m_config).drawCallCount);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  pppTVar1 = &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
  std::operator<<((ostream *)pppTVar1,"Number of triangles rendered by each draw call: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&threadContexts,&(this->m_config).triangleCount);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  if ((this->m_config).sharedContexts == true) {
    pppTVar1 = &threadContexts.
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
    std::operator<<((ostream *)pppTVar1,"Shared contexts.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    pppTVar1 = &threadContexts.
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
    std::operator<<((ostream *)pppTVar1,"No shared contexts.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  if ((this->m_config).useCoordBuffer == true) {
    pppTVar1 = &threadContexts.
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
    pcVar20 = "";
    if ((this->m_config).sharedCoordBuffer != false) {
      pcVar20 = "Shared ";
    }
    std::operator<<((ostream *)pppTVar1,pcVar20);
    std::operator<<((ostream *)pppTVar1,"Coordinate buffer");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    pppTVar1 = &threadContexts.
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
    std::operator<<((ostream *)pppTVar1,"Coordinates from pointer");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  if ((this->m_config).useIndices == true) {
    pppTVar1 = &threadContexts.
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
    std::operator<<((ostream *)pppTVar1,"Using glDrawElements with indices from ");
    pcVar20 = "";
    if ((this->m_config).sharedIndexBuffer != false) {
      pcVar20 = "shared ";
    }
    std::operator<<((ostream *)pppTVar1,pcVar20);
    pcVar20 = "pointer.";
    if ((this->m_config).useIndexBuffer != false) {
      pcVar20 = "buffer.";
    }
    std::operator<<((ostream *)pppTVar1,pcVar20);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  }
  if ((this->m_config).useTexture == true) {
    switch((this->m_config).textureType) {
    case TEXTURETYPE_TEXTURE:
      pppTVar1 = &threadContexts.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      threadContexts.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
      std::operator<<((ostream *)pppTVar1,"Use texture.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case TEXTURETYPE_SHARED_TEXTURE:
      pppTVar1 = &threadContexts.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      threadContexts.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
      std::operator<<((ostream *)pppTVar1,"Use shared texture.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case TEXTURETYPE_IMAGE:
      pppTVar1 = &threadContexts.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      threadContexts.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
      std::operator<<((ostream *)pppTVar1,"Use texture created from EGLImage.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case TEXTURETYPE_SHARED_IMAGE:
      pppTVar1 = &threadContexts.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      threadContexts.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
      std::operator<<((ostream *)pppTVar1,"Use texture created from shared EGLImage.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    case TEXTURETYPE_SHARED_IMAGE_TEXTURE:
      pppTVar1 = &threadContexts.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      threadContexts.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
      std::operator<<((ostream *)pppTVar1,"Use shared texture created from EGLImage.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
      break;
    default:
      goto switchD_0020b3a0_default;
    }
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &threadContexts.
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish);
switchD_0020b3a0_default:
    pppTVar1 = &threadContexts.
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
    std::operator<<((ostream *)pppTVar1,"Texture size: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&threadContexts,&(this->m_config).textureWidth);
    std::operator<<((ostream *)&pMVar7->m_str,"x");
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&(this->m_config).textureHeight);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  }
  if ((this->m_config).sharedProgram == true) {
    pppTVar1 = &threadContexts.
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
    std::operator<<((ostream *)pppTVar1,"Shared program.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  }
  pppTVar1 = &threadContexts.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
  std::operator<<((ostream *)pppTVar1,"Surface size: ");
  pMVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&threadContexts,&(this->m_config).surfaceWidth);
  std::operator<<((ostream *)&pMVar7->m_str,"x");
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&(this->m_config).surfaceHeight);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
  tcu::ScopedLogSection::~ScopedLogSection(&threadSection);
LAB_0020b611:
  iVar23 = (this->m_config).threadCount;
  uVar2 = (this->m_config).perThreadContextCount;
  pcVar20 = (char *)(ulong)uVar2;
  __p = &threadContexts;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  threadContexts.
  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar26 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  if (iVar23 < 1) {
    iVar23 = 0;
  }
  ppTVar21 = (pointer)0x0;
  for (iVar16 = 0; uVar25 = uVar8,
      this_03 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                 *)threadContexts.
                   super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
      local_2f8 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                   *)threadContexts.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish, iVar13 = iVar26, iVar16 != iVar23;
      iVar16 = iVar16 + 1) {
    while (local_2ec = iVar16,
          ppTVar24 = threadContexts.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish, uVar25 != 0) {
      ppTVar4 = (this->m_contexts).
                super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (threadContexts.
          super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          threadContexts.
          super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        this_01 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                   *)std::
                     vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                     ::_M_check_len(&threadContexts,(size_type)__p,pcVar20);
        __dest = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                  *)std::
                    _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                    ::_M_allocate(this_01,(size_t)__p);
        sVar22 = (long)ppTVar24 - (long)this_03;
        *(TestContext **)((long)__dest + sVar22) = ppTVar4[iVar13];
        sVar15 = extraout_RDX;
        if (0 < (long)sVar22) {
          memmove(__dest,this_03,sVar22);
          sVar15 = extraout_RDX_00;
        }
        ppTVar24 = (pointer)((long)__dest + sVar22);
        __p = (vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
               *)((long)sVar22 >> 3);
        std::
        _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
        ::_M_deallocate(this_03,(pointer)__p,sVar15);
        threadContexts.
        super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(&(__dest->_M_impl).super__Vector_impl_data._M_start + (long)this_01);
        pcVar20 = extraout_RDX_01;
        local_2f8 = __dest;
        threadContexts.
        super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
      }
      else {
        *threadContexts.
         super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = ppTVar4[iVar13];
        __dest = this_03;
      }
      threadContexts.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar24 + 1;
      uVar25 = uVar25 - 1;
      this_03 = __dest;
      iVar16 = local_2ec;
      iVar13 = iVar13 + 1;
    }
    pTVar9 = (TestThread *)operator_new(0x88);
    std::
    vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ::vector((vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              *)&local_278,&threadContexts);
    de::Thread::Thread((Thread *)pTVar9);
    (pTVar9->super_Thread)._vptr_Thread = (_func_int **)&PTR__TestThread_003d77a0;
    std::
    vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ::vector(&pTVar9->m_contexts,
             (vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
              *)&local_278);
    pTVar9->m_isOk = false;
    __p = (vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
           *)0x32f764;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&pTVar9->m_errorString,"",(allocator<char> *)&threadSection);
    ppTVar6 = threads.
              super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pTVar9->m_startBeginUs = 0;
    pTVar9->m_startEndUs = 0;
    pTVar9->m_joinBeginUs = 0;
    pTVar9->m_joinEndUs = 0;
    pTVar9->m_beginTimeUs = 0;
    pTVar9->m_endTimeUs = 0;
    if (threads.
        super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        threads.
        super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      sVar22 = (long)threads.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)threads.
                     super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (sVar22 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      __p = (vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
             *)((long)sVar22 >> 3);
      pvVar10 = __p;
      if (threads.
          super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          threads.
          super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        pvVar10 = (vector<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                   *)0x1;
      }
      uVar25 = (long)&(pvVar10->
                      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                      )._M_impl.super__Vector_impl_data._M_start +
               (long)&(__p->
                      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
      if (0xffffffffffffffe < uVar25) {
        uVar25 = 0xfffffffffffffff;
      }
      if (CARRY8((ulong)pvVar10,(ulong)__p)) {
        uVar25 = 0xfffffffffffffff;
      }
      if (uVar25 == 0) {
        __dest_00 = (pointer)0x0;
        sVar15 = extraout_RDX_02;
      }
      else {
        __dest_00 = (pointer)operator_new(uVar25 * 8);
        sVar15 = extraout_RDX_03;
      }
      __dest_00[(long)__p] = pTVar9;
      if (0 < (long)sVar22) {
        memmove(__dest_00,ppTVar6,sVar22);
        sVar15 = extraout_RDX_04;
      }
      ppTVar21 = (pointer)(sVar22 + (long)__dest_00);
      std::
      _Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
      ::_M_deallocate((_Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
                       *)ppTVar6,(pointer)__p,sVar15);
      threads.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest_00 + uVar25;
      threads.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
      ._M_impl.super__Vector_impl_data._M_start = __dest_00;
    }
    else {
      *threads.
       super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
       ._M_impl.super__Vector_impl_data._M_finish = pTVar9;
      ppTVar21 = threads.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    iVar16 = local_2ec;
    ppTVar21 = ppTVar21 + 1;
    threads.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppTVar21;
    std::
    _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ::~_Vector_base((_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                     *)&local_278);
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2f8;
    iVar26 = iVar26 + uVar2;
    pcVar20 = extraout_RDX_05;
  }
  std::
  _Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
  ::~_Vector_base(&threadContexts.
                   super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                 );
  local_2f8 = (_Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
               *)deGetMicroseconds();
  ppTVar6 = threads.
            super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = (ulong)((long)ppTVar21 -
                 (long)threads.
                       super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar23 = (int)uVar8;
  lVar18 = (long)iVar23;
  lVar27 = 0;
  lVar19 = 0;
  if (0 < lVar18) {
    lVar19 = lVar18;
  }
  for (; lVar19 != lVar27; lVar27 = lVar27 + 1) {
    pTVar9 = ppTVar6[lVar27];
    dVar11 = deGetMicroseconds();
    pTVar9->m_startBeginUs = dVar11;
    de::Thread::start(&pTVar9->super_Thread);
    dVar11 = deGetMicroseconds();
    pTVar9->m_startEndUs = dVar11;
  }
  for (lVar27 = 0; lVar19 != lVar27; lVar27 = lVar27 + 1) {
    pTVar9 = ppTVar6[lVar27];
    dVar11 = deGetMicroseconds();
    pTVar9->m_joinBeginUs = dVar11;
    de::Thread::join(&pTVar9->super_Thread);
    dVar11 = deGetMicroseconds();
    pTVar9->m_joinEndUs = dVar11;
  }
  dVar11 = deGetMicroseconds();
  uVar25 = 0;
  if (0 < iVar23) {
    uVar25 = uVar8 & 0xffffffff;
  }
  uVar8 = 0xffffffffffffffff;
  do {
    uVar14 = uVar25;
    if (uVar8 - uVar25 == -1) break;
    lVar27 = uVar8 + 1;
    uVar14 = uVar8 + 1;
    uVar8 = uVar14;
  } while (ppTVar6[lVar27]->m_isOk != false);
  if ((long)uVar14 < lVar18) {
    IVar17 = STOP;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail");
  }
  else {
    for (lVar18 = 0; lVar19 != lVar18; lVar18 = lVar18 + 1) {
      if (ppTVar6[lVar18] != (TestThread *)0x0) {
        (*(ppTVar6[lVar18]->super_Thread)._vptr_Thread[1])();
      }
      ppTVar6[lVar18] = (TestThread *)0x0;
    }
    if (ppTVar21 != ppTVar6) {
      threads.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar6;
    }
    threadContexts.
    super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)(dVar11 - (long)local_2f8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&this->m_results,(unsigned_long *)&threadContexts);
    if (this->m_iterationCount ==
        (int)((ulong)((long)(this->m_results).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_results).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3)) {
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pTVar3 = this_00->m_log;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&resultsUs,&this->m_results);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&threadSection,"Result",&local_2f9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Result",&local_2fa);
      tcu::LogSampleList::LogSampleList(&local_278,(string *)&threadSection,&local_218);
      tcu::LogSampleList::write(&local_278,(int)pTVar3,__buf,uVar14);
      tcu::TestLog::startSampleInfo(pTVar3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"Time",&local_2fb);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Time",&local_2fc);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"us",&local_2fd);
      unit = &local_70;
      tcu::LogValueInfo::LogValueInfo
                ((LogValueInfo *)&threadContexts,&local_238,&local_50,unit,
                 QP_SAMPLE_VALUE_TAG_RESPONSE);
      tcu::LogValueInfo::write((LogValueInfo *)&threadContexts,(int)pTVar3,__buf_00,(size_t)unit);
      tcu::TestLog::endSampleInfo(pTVar3);
      tcu::LogValueInfo::~LogValueInfo((LogValueInfo *)&threadContexts);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_238);
      tcu::LogSampleList::~LogSampleList(&local_278);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&threadSection);
      for (lVar19 = 0;
          lVar19 < (int)((ulong)((long)resultsUs.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)resultsUs.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar19 = lVar19 + 1) {
        threadContexts.
        super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        threadContexts.
        super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        threadContexts.
        super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
        this_02 = tcu::SampleBuilder::operator<<
                            ((SampleBuilder *)&threadContexts,
                             resultsUs.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar19]);
        tcu::SampleBuilder::operator<<(this_02,(EndSampleToken *)&tcu::TestLog::EndSample);
        std::_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>::
        ~_Vector_base((_Vector_base<tcu::SampleBuilder::Value,_std::allocator<tcu::SampleBuilder::Value>_>
                       *)&threadContexts.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      }
      tcu::TestLog::endSampleList(pTVar3);
      std::
      __sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      uVar8 = (long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
      uVar25 = 0;
      uVar14 = 0;
      if (0 < (int)uVar8) {
        uVar14 = uVar8 & 0xffffffff;
      }
      uVar12 = 0;
      for (; uVar14 != uVar25; uVar25 = uVar25 + 1) {
        uVar12 = uVar12 + resultsUs.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar25];
      }
      uVar12 = uVar12 / uVar8;
      uVar5 = *(undefined8 *)
               ((long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + (uVar8 & 0xfffffffffffffffe) * 4);
      dVar28 = 0.0;
      for (uVar25 = 0; uVar14 != uVar25; uVar25 = uVar25 + 1) {
        lVar19 = (resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar25] - uVar12) *
                 (resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar25] - uVar12);
        auVar34._8_4_ = (int)((ulong)lVar19 >> 0x20);
        auVar34._0_8_ = lVar19;
        auVar34._12_4_ = 0x45300000;
        dVar28 = dVar28 + (auVar34._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0);
      }
      auVar31._8_4_ =
           (int)((long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 0x23);
      auVar31._0_8_ = uVar8;
      auVar31._12_4_ = 0x45300000;
      dVar28 = dVar28 / ((auVar31._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
      if (dVar28 < 0.0) {
        dVar28 = sqrt(dVar28);
      }
      else {
        dVar28 = SQRT(dVar28);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&threadContexts,"Statistics from results",(allocator<char> *)&local_218);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,"Statistics from results",(allocator<char> *)&local_238);
      tcu::ScopedLogSection::ScopedLogSection
                (&threadSection,pTVar3,(string *)&threadContexts,&local_278.m_name);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&threadContexts);
      pppTVar1 = &threadContexts.
                  super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      threadContexts.
      super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pTVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pppTVar1);
      std::operator<<((ostream *)pppTVar1,"Average: ");
      auVar32._8_4_ = (int)(uVar12 >> 0x20);
      auVar32._0_8_ = uVar12;
      auVar32._12_4_ = 0x45300000;
      dVar29 = ((auVar32._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar12) - 4503599627370496.0)) / 1000.0;
      std::ostream::_M_insert<double>(dVar29);
      std::operator<<((ostream *)pppTVar1,"ms\n");
      std::operator<<((ostream *)pppTVar1,"Standard deviation: ");
      std::ostream::_M_insert<double>(dVar28 / 1000.0);
      std::operator<<((ostream *)pppTVar1,"ms\n");
      std::operator<<((ostream *)pppTVar1,"Standard error of mean: ");
      lVar19 = (long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      auVar30._8_4_ =
           (int)((long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 0x23);
      auVar30._0_8_ = lVar19;
      auVar30._12_4_ = 0x45300000;
      std::ostream::_M_insert<double>
                ((dVar28 / SQRT((auVar30._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0))) /
                 1000.0);
      std::operator<<((ostream *)pppTVar1,"ms\n");
      std::operator<<((ostream *)pppTVar1,"Median: ");
      auVar33._8_4_ = (int)((ulong)uVar5 >> 0x20);
      auVar33._0_8_ = uVar5;
      auVar33._12_4_ = 0x45300000;
      std::ostream::_M_insert<double>
                (((auVar33._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) / 1000.0);
      std::operator<<((ostream *)pppTVar1,"ms\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&threadContexts,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppTVar1);
      tcu::ScopedLogSection::~ScopedLogSection(&threadSection);
      de::floatToString_abi_cxx11_((string *)&threadContexts,(de *)0x2,(float)dVar29,precision);
      IVar17 = STOP;
      tcu::TestContext::setTestResult
                (this_00,QP_TEST_RESULT_PASS,
                 (char *)threadContexts.
                         super__Vector_base<deqp::egl::(anonymous_namespace)::TestContext_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestContext_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      std::__cxx11::string::~string((string *)&threadContexts);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&resultsUs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    }
    else {
      IVar17 = CONTINUE;
    }
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::TestThread_*,_std::allocator<deqp::egl::(anonymous_namespace)::TestThread_*>_>
  ::~vector(&threads);
  return IVar17;
}

Assistant:

TestCase::IterateResult SharedRenderingPerfCase::iterate (void)
{
	deUint64			beginTimeUs;
	deUint64			endTimeUs;
	vector<TestThread*>	threads;

	if (m_results.empty())
		logTestConfig(m_testCtx.getLog(), m_config);

	createThreads(threads, m_config.threadCount, m_config.perThreadContextCount, m_contexts);

	beginTimeUs = deGetMicroseconds();

	startThreads(threads);
	joinThreads(threads);

	endTimeUs = deGetMicroseconds();

	if (!threadResultsOk(threads))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	destroyThreads(threads);

	m_results.push_back(endTimeUs - beginTimeUs);

	if ((int)m_results.size() == m_iterationCount)
	{
		logAndSetResults(m_testCtx, m_results);
		return STOP;
	}
	else
		return CONTINUE;
}